

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManBuildFromMiniInt(Gia_Man_t *pNew,Vec_Int_t *vLeaves,Vec_Int_t *vAig,int fHash)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  
  iVar1 = vAig->nSize;
  uVar6 = (ulong)iVar1;
  if ((long)uVar6 < 1) {
    __assert_fail("Vec_IntSize(vAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x34b,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  puVar4 = (uint *)vAig->pArray;
  if (1 < (int)puVar4[uVar6 - 1]) {
    __assert_fail("Vec_IntEntryLast(vAig) < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x34c,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  if (iVar1 == 2) {
    if (*puVar4 != 0) {
      __assert_fail("Vec_IntEntry(vAig, 0) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                    ,0x351,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if (vLeaves->nSize != 1) {
      __assert_fail("Vec_IntSize(vLeaves) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                    ,0x352,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if (*vLeaves->pArray < 0) {
LAB_0020e021:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    uVar3 = *vLeaves->pArray ^ (uint)(0 < (int)puVar4[1]);
  }
  else if (iVar1 == 1) {
    uVar3 = *puVar4;
  }
  else {
    if ((uVar6 & 1) == 0) {
      __assert_fail("Vec_IntSize(vAig) & 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                    ,0x359,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    iVar1 = vLeaves->nSize;
    lVar12 = 0;
    uVar11 = 0;
    do {
      uVar3 = puVar4[lVar12 * 2];
      if (((int)uVar3 < 0) || (uVar5 = puVar4[lVar12 * 2 + 1], (int)uVar5 < 0)) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar9 = uVar3 >> 1;
      uVar2 = uVar9 - iVar1;
      if ((int)uVar9 < iVar1) {
        if (vLeaves->nSize <= (int)uVar9) goto LAB_0020e040;
        puVar8 = (uint *)vLeaves->pArray;
        uVar2 = uVar9;
      }
      else if (((int)uVar2 < 0) || (puVar8 = puVar4, (int)uVar6 <= (int)uVar2)) goto LAB_0020e040;
      if ((int)puVar8[uVar2] < 0) goto LAB_0020e021;
      uVar10 = uVar5 >> 1;
      uVar9 = uVar10 - iVar1;
      if ((int)uVar10 < iVar1) {
        if (vLeaves->nSize <= (int)uVar10) goto LAB_0020e040;
        puVar4 = (uint *)vLeaves->pArray;
        uVar9 = uVar10;
      }
      else if (((int)uVar9 < 0) || ((int)uVar6 <= (int)uVar9)) goto LAB_0020e040;
      if ((int)puVar4[uVar9] < 0) goto LAB_0020e021;
      uVar3 = puVar8[uVar2] ^ uVar3 & 1;
      uVar5 = puVar4[uVar9] ^ uVar5 & 1;
      if (fHash == 0) {
        if (uVar3 != uVar5) {
          uVar3 = Gia_ManAppendAnd(pNew,uVar3,uVar5);
        }
      }
      else {
        uVar3 = Gia_ManHashAnd(pNew,uVar3,uVar5);
      }
      if (vAig->nSize <= (int)lVar12) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      puVar4 = (uint *)vAig->pArray;
      puVar4[lVar12] = uVar3;
      uVar2 = uVar11 + 2;
      uVar5 = vAig->nSize;
      uVar6 = (ulong)uVar5;
      lVar12 = lVar12 + 1;
      iVar7 = uVar11 + 3;
      uVar11 = uVar2;
    } while (iVar7 < (int)uVar5);
    if (uVar2 != uVar5 - 1) {
      __assert_fail("i == Vec_IntSize(vAig) - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                    ,0x369,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if ((int)uVar5 <= (int)uVar2) {
LAB_0020e040:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((int)uVar3 < 0) goto LAB_0020e021;
    uVar3 = uVar3 ^ 0 < (int)puVar4[uVar2];
    vAig->nSize = 0;
  }
  return uVar3;
}

Assistant:

int Gia_ManBuildFromMiniInt( Gia_Man_t * pNew, Vec_Int_t * vLeaves, Vec_Int_t * vAig, int fHash )
{
    assert( Vec_IntSize(vAig) > 0 );
    assert( Vec_IntEntryLast(vAig) < 2 );
    if ( Vec_IntSize(vAig) == 1 ) // const
        return Vec_IntEntry(vAig, 0);
    if ( Vec_IntSize(vAig) == 2 ) // variable
    {
        assert( Vec_IntEntry(vAig, 0) == 0 );
        assert( Vec_IntSize(vLeaves) == 1 );
        return Abc_LitNotCond( Vec_IntEntry(vLeaves, 0), Vec_IntEntry(vAig, 1) );
    }
    else
    {
        int nLeaves = Vec_IntSize(vLeaves);
        int i, iVar0, iVar1, iLit0, iLit1, iLit = 0;
        assert( Vec_IntSize(vAig) & 1 );
        Vec_IntForEachEntryDouble( vAig, iLit0, iLit1, i )
        {
            iVar0 = Abc_Lit2Var( iLit0 );
            iVar1 = Abc_Lit2Var( iLit1 );
            iLit0 = Abc_LitNotCond( iVar0 < nLeaves ? Vec_IntEntry(vLeaves, iVar0) : Vec_IntEntry(vAig, iVar0 - nLeaves), Abc_LitIsCompl(iLit0) );
            iLit1 = Abc_LitNotCond( iVar1 < nLeaves ? Vec_IntEntry(vLeaves, iVar1) : Vec_IntEntry(vAig, iVar1 - nLeaves), Abc_LitIsCompl(iLit1) );
            if ( fHash )
                iLit = Gia_ManHashAnd( pNew, iLit0, iLit1 );
            else if ( iLit0 == iLit1 )
                iLit = iLit0;
            else
                iLit = Gia_ManAppendAnd( pNew, iLit0, iLit1 );
            assert( (i & 1) == 0 );
            Vec_IntWriteEntry( vAig, Abc_Lit2Var(i), iLit );  // overwriting entries
        }
        assert( i == Vec_IntSize(vAig) - 1 );
        iLit = Abc_LitNotCond( iLit, Vec_IntEntry(vAig, i) );
        Vec_IntClear( vAig ); // useless
        return iLit;
    }
}